

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O0

int light_subcapture(light_pcapng section,_func_light_boolean_light_pcapng *predicate,
                    light_pcapng *subcapture)

{
  light_boolean lVar1;
  int iVar2;
  _light_pcapng *p_Var3;
  undefined8 *in_RDX;
  _light_pcapng *in_RSI;
  _light_pcapng *in_RDI;
  light_pcapng next_block;
  light_pcapng iterator;
  light_pcapng root;
  _light_pcapng *local_38;
  _light_pcapng *local_30;
  _light_pcapng *section_00;
  int local_4;
  
  lVar1 = __is_section_header(in_RDI);
  if (lVar1 == LIGHT_FALSE) {
    fprintf(_stderr,"Error at: %s::%s::%d, %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_manipulate.c"
            ,"light_subcapture",0xb4,"\"Invalid section header\"");
    local_4 = -1;
  }
  else {
    local_30 = __copy_block(in_RSI,(light_boolean)((ulong)in_RDX >> 0x20));
    section_00 = local_30;
    for (local_38 = in_RDI->next_block; local_38 != (_light_pcapng *)0x0;
        local_38 = local_38->next_block) {
      iVar2 = (*(code *)in_RSI)(local_38);
      if (iVar2 != 0) {
        p_Var3 = __copy_block(in_RSI,(light_boolean)((ulong)in_RDX >> 0x20));
        local_30->next_block = p_Var3;
        local_30 = local_30->next_block;
      }
    }
    *in_RDX = section_00;
    local_4 = __validate_section(section_00);
  }
  return local_4;
}

Assistant:

int light_subcapture(const light_pcapng section, light_boolean (*predicate)(const light_pcapng), light_pcapng *subcapture)
{
	if (__is_section_header(section) == 0) {
		PCAPNG_ERROR("Invalid section header");
		return LIGHT_INVALID_SECTION;
	}

	// Root section header is automatically included into the subcapture.
	light_pcapng root = __copy_block(section, LIGHT_FALSE);
	light_pcapng iterator = root;
	light_pcapng next_block = section->next_block;

	while (next_block != NULL) {
		// Predicate functions applies to all block types, including section header blocks.
		if (!!predicate(next_block) == LIGHT_TRUE) {
			iterator->next_block = __copy_block(next_block, LIGHT_FALSE);
			iterator = iterator->next_block;
		}
		next_block = next_block->next_block;
	}

	*subcapture = root;
	return __validate_section(*subcapture);

}